

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall vkt::shaderexecutor::Functions::PreciseFunc1::~PreciseFunc1(PreciseFunc1 *this)

{
  CFloatFunc1::~CFloatFunc1(&this->super_CFloatFunc1);
  operator_delete(this,0x30);
  return;
}

Assistant:

PreciseFunc1	(const string& name, DoubleFunc1& func) : CFloatFunc1(name, func) {}